

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::csharp::IsNullable(FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *descriptor_local;
  
  local_18 = descriptor;
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if (bVar1) {
    descriptor_local._7_1_ = true;
  }
  else {
    TVar2 = FieldDescriptor::type(local_18);
    if (7 < TVar2 - TYPE_DOUBLE) {
      if (TVar2 - TYPE_STRING < 4) {
        return true;
      }
      if (5 < TVar2 - TYPE_UINT32) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_helpers.cc"
                   ,0x1b2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar3,(char (*) [20])"Unknown field type.");
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
    }
    descriptor_local._7_1_ = false;
  }
  return descriptor_local._7_1_;
}

Assistant:

bool IsNullable(const FieldDescriptor* descriptor) {
  if (descriptor->is_repeated()) {
    return true;
  }

  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
      return false;

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES:
      return true;

    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return true;
  }
}